

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvsRoberts_ASAi_dns.c
# Opt level: O3

int fB(sunrealtype t,N_Vector y,N_Vector yB,N_Vector yBdot,void *user_dataB)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double *pdVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  UserData data;
  double dVar9;
  
  dVar1 = *(double *)((long)user_dataB + 0x10);
  pdVar5 = *(double **)((long)yB->content + 0x10);
  dVar2 = pdVar5[1];
  dVar3 = pdVar5[2];
  dVar9 = dVar2 - *pdVar5;
  lVar6 = *(long *)((long)y->content + 0x10);
  dVar4 = *(double *)((long)user_dataB + 8);
  pdVar5 = *(double **)((long)yBdot->content + 0x10);
  dVar7 = *(double *)(lVar6 + 8);
  dVar8 = *(double *)(lVar6 + 0x10);
  *pdVar5 = -*user_dataB * dVar9;
  pdVar5[1] = dVar1 * -2.0 * dVar7 * (dVar3 - dVar2) + dVar8 * dVar4 * dVar9;
  pdVar5[2] = dVar7 * dVar4 * dVar9 + -1.0;
  return 0;
}

Assistant:

static int fB(sunrealtype t, N_Vector y, N_Vector yB, N_Vector yBdot,
              void* user_dataB)
{
  UserData data;
  sunrealtype y2, y3;
  sunrealtype p1, p2, p3;
  sunrealtype l1, l2, l3;
  sunrealtype l21, l32;

  data = (UserData)user_dataB;

  /* The p vector */
  p1 = data->p[0];
  p2 = data->p[1];
  p3 = data->p[2];

  /* The y vector */
  y2 = Ith(y, 2);
  y3 = Ith(y, 3);

  /* The lambda vector */
  l1 = Ith(yB, 1);
  l2 = Ith(yB, 2);
  l3 = Ith(yB, 3);

  /* Temporary variables */
  l21 = l2 - l1;
  l32 = l3 - l2;

  /* Load yBdot */
  Ith(yBdot, 1) = -p1 * l21;
  Ith(yBdot, 2) = p2 * y3 * l21 - SUN_RCONST(2.0) * p3 * y2 * l32;
  Ith(yBdot, 3) = p2 * y2 * l21 - SUN_RCONST(1.0);

  return (0);
}